

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O1

void __thiscall
TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test::
~TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test
          (TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupUnitTestMacros_0038df28;
  TestTestingFixture::~TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupUnitTestMacros).fixture);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(UnitTestMacros, FailureWithSIGNED_BYTES_EQUAL)
{
    fixture.runTestWithMethod(failingTestMethodWithSIGNED_BYTES_EQUAL_);
#if CPPUTEST_CHAR_BIT == 16
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("expected <-1 (0xffff)>");
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("but was  <-2 (0xfffe)>");
#elif CPPUTEST_CHAR_BIT == 8
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("expected <-1 (0xff)>");
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("but was  <-2 (0xfe)>");
#endif
}